

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_unpacked.c
# Opt level: O0

int UNPK_stat(void *opaque,char *path,PHYSFS_Stat *stat)

{
  UNPKentry *pUVar1;
  UNPKentry *entry;
  UNPKinfo *info;
  PHYSFS_Stat *stat_local;
  char *path_local;
  void *opaque_local;
  
  pUVar1 = findEntry((UNPKinfo *)opaque,path);
  if (pUVar1 == (UNPKentry *)0x0) {
    opaque_local._4_4_ = 0;
  }
  else {
    if ((pUVar1->tree).isdir == 0) {
      stat->filetype = PHYSFS_FILETYPE_REGULAR;
      stat->filesize = pUVar1->size;
    }
    else {
      stat->filetype = PHYSFS_FILETYPE_DIRECTORY;
      stat->filesize = 0;
    }
    stat->modtime = pUVar1->mtime;
    stat->createtime = pUVar1->ctime;
    stat->accesstime = -1;
    stat->readonly = 1;
    opaque_local._4_4_ = 1;
  }
  return opaque_local._4_4_;
}

Assistant:

int UNPK_stat(void *opaque, const char *path, PHYSFS_Stat *stat)
{
    UNPKinfo *info = (UNPKinfo *) opaque;
    const UNPKentry *entry = findEntry(info, path);

    BAIL_IF_ERRPASS(!entry, 0);

    if (entry->tree.isdir)
    {
        stat->filetype = PHYSFS_FILETYPE_DIRECTORY;
        stat->filesize = 0;
    } /* if */
    else
    {
        stat->filetype = PHYSFS_FILETYPE_REGULAR;
        stat->filesize = entry->size;
    } /* else */

    stat->modtime = entry->mtime;
    stat->createtime = entry->ctime;
    stat->accesstime = -1;
    stat->readonly = 1;

    return 1;
}